

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O3

LY_ERR lyxml_value_compare(ly_ctx *ctx1,char *value1,void *val_prefix_data1,ly_ctx *ctx2,
                          char *value2,void *val_prefix_data2)

{
  char *__s2;
  LY_ERR LVar1;
  int iVar2;
  lys_module *plVar3;
  lys_module *plVar4;
  LY_ERR LVar5;
  bool bVar6;
  bool bVar7;
  ly_bool is_prefix2;
  ly_bool is_prefix1;
  uint32_t value2_len;
  uint32_t value1_len;
  char *value2_next;
  char *value1_next;
  ly_bool local_5a;
  ly_bool local_59;
  uint local_58;
  uint local_54;
  ly_ctx *local_50;
  void *local_48;
  char *local_40;
  char *local_38;
  
  bVar6 = value1 != (char *)0x0;
  bVar7 = value2 != (char *)0x0;
  LVar1 = LY_SUCCESS;
  if ((value1 != (char *)0x0 || value2 != (char *)0x0) &&
     (LVar1 = LY_ENOT, (value1 != (char *)0x0) == (value2 != (char *)0x0))) {
    if (ctx2 == (ly_ctx *)0x0) {
      ctx2 = ctx1;
    }
    LVar5 = LY_SUCCESS;
    local_50 = ctx1;
    local_48 = val_prefix_data1;
    if (value1 != (char *)0x0 && value2 != (char *)0x0) {
LAB_001a271b:
      LVar1 = ly_value_prefix_next(value1,(char *)0x0,&local_54,&local_59,&local_38);
      bVar6 = true;
      if ((LVar1 == LY_SUCCESS) &&
         (LVar1 = ly_value_prefix_next(value2,(char *)0x0,&local_58,&local_5a,&local_40),
         LVar1 == LY_SUCCESS)) {
        LVar1 = LY_ENOT;
        LVar5 = LY_ENOT;
        if (local_59 != local_5a) goto LAB_001a286a;
        if (local_59 == '\0') {
          if (local_54 != local_58) goto LAB_001a286a;
          iVar2 = strncmp(value1,value2,(ulong)local_54);
LAB_001a281f:
          bVar7 = true;
          if (iVar2 == 0) goto LAB_001a2842;
          goto LAB_001a286c;
        }
        if (local_48 == (void *)0x0) {
          plVar3 = (lys_module *)0x0;
        }
        else {
          plVar3 = ly_resolve_prefix(local_50,value1,(ulong)local_54,LY_VALUE_XML,local_48);
        }
        if (((val_prefix_data2 == (void *)0x0) ||
            (plVar4 = ly_resolve_prefix(ctx2,value2,(ulong)local_58,LY_VALUE_XML,val_prefix_data2),
            plVar3 == (lys_module *)0x0)) || (plVar4 == (lys_module *)0x0)) goto LAB_001a286a;
        if (plVar3->ctx == plVar4->ctx) {
          if (plVar3->name != plVar4->name) goto LAB_001a286a;
          bVar7 = true;
          if (plVar3->revision != plVar4->revision) goto LAB_001a286c;
LAB_001a2842:
          bVar7 = local_40 != (char *)0x0;
          LVar5 = LY_SUCCESS;
          bVar6 = local_38 != (char *)0x0;
          if ((local_38 == (char *)0x0) ||
             (value1 = local_38, value2 = local_40, local_40 == (char *)0x0)) goto LAB_001a286c;
          goto LAB_001a271b;
        }
        iVar2 = strcmp(plVar3->name,plVar4->name);
        if (iVar2 != 0) goto LAB_001a286a;
        __s2 = plVar4->revision;
        if (plVar3->revision == (char *)0x0) {
          bVar7 = true;
          if (__s2 == (char *)0x0) goto LAB_001a2842;
          goto LAB_001a286c;
        }
        if (__s2 != (char *)0x0) {
          iVar2 = strcmp(plVar3->revision,__s2);
          goto LAB_001a281f;
        }
      }
LAB_001a286a:
      LVar5 = LVar1;
      bVar7 = true;
    }
LAB_001a286c:
    LVar1 = LY_ENOT;
    if (!bVar6 && !bVar7) {
      LVar1 = LVar5;
    }
  }
  return LVar1;
}

Assistant:

LY_ERR
lyxml_value_compare(const struct ly_ctx *ctx1, const char *value1, void *val_prefix_data1,
        const struct ly_ctx *ctx2, const char *value2, void *val_prefix_data2)
{
    const char *value1_iter, *value2_iter;
    const char *value1_next, *value2_next;
    uint32_t value1_len, value2_len;
    ly_bool is_prefix1, is_prefix2;
    const struct lys_module *mod1, *mod2;
    LY_ERR ret;

    if (!value1 && !value2) {
        return LY_SUCCESS;
    }
    if ((value1 && !value2) || (!value1 && value2)) {
        return LY_ENOT;
    }

    if (!ctx2) {
        ctx2 = ctx1;
    }

    ret = LY_SUCCESS;
    for (value1_iter = value1, value2_iter = value2;
            value1_iter && value2_iter;
            value1_iter = value1_next, value2_iter = value2_next) {
        if ((ret = ly_value_prefix_next(value1_iter, NULL, &value1_len, &is_prefix1, &value1_next))) {
            break;
        }
        if ((ret = ly_value_prefix_next(value2_iter, NULL, &value2_len, &is_prefix2, &value2_next))) {
            break;
        }

        if (is_prefix1 != is_prefix2) {
            ret = LY_ENOT;
            break;
        }

        if (!is_prefix1) {
            if (value1_len != value2_len) {
                ret = LY_ENOT;
                break;
            }
            if (strncmp(value1_iter, value2_iter, value1_len)) {
                ret = LY_ENOT;
                break;
            }
            continue;
        }

        mod1 = mod2 = NULL;
        if (val_prefix_data1) {
            /* find module of the first prefix, if any */
            mod1 = ly_resolve_prefix(ctx1, value1_iter, value1_len, LY_VALUE_XML, val_prefix_data1);
        }
        if (val_prefix_data2) {
            mod2 = ly_resolve_prefix(ctx2, value2_iter, value2_len, LY_VALUE_XML, val_prefix_data2);
        }
        if (!mod1 || !mod2) {
            /* not a prefix or maps to different namespaces */
            ret = LY_ENOT;
            break;
        }

        if (mod1->ctx == mod2->ctx) {
            /* same contexts */
            if ((mod1->name != mod2->name) || (mod1->revision != mod2->revision)) {
                ret = LY_ENOT;
                break;
            }
        } else {
            /* different contexts */
            if (strcmp(mod1->name, mod2->name)) {
                ret = LY_ENOT;
                break;
            }

            if (mod1->revision || mod2->revision) {
                if (!mod1->revision || !mod2->revision) {
                    ret = LY_ENOT;
                    break;
                }
                if (strcmp(mod1->revision, mod2->revision)) {
                    ret = LY_ENOT;
                    break;
                }
            }
        }
    }

    if (value1_iter || value2_iter) {
        ret = LY_ENOT;
    }

    return ret;
}